

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O1

ConstPixelBufferAccess * __thiscall
vkt::Draw::Image::readVolume
          (ConstPixelBufferAccess *__return_storage_ptr__,Image *this,VkQueue queue,
          Allocator *allocator,VkImageLayout layout,VkOffset3D offset,int width,int height,int depth
          ,VkImageAspectFlagBits aspect,uint mipLevel,uint arrayElement)

{
  pointer __s;
  int iVar1;
  TextureFormat local_38;
  
  local_38 = ::vk::mapVkFormat(this->m_format);
  iVar1 = tcu::TextureFormat::getPixelSize(&local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_pixelAccessData,(long)(iVar1 * depth * height * width));
  __s = (this->m_pixelAccessData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start;
  memset(__s,0,(long)(this->m_pixelAccessData).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)__s);
  if ((aspect == VK_IMAGE_ASPECT_STENCIL_BIT) || (aspect == VK_IMAGE_ASPECT_DEPTH_BIT)) {
    readUsingBuffer(this,queue,allocator,layout,offset,width,height,depth,mipLevel,arrayElement,
                    aspect,(this->m_pixelAccessData).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  }
  else if (aspect == VK_IMAGE_ASPECT_COLOR_BIT) {
    read(this,(int)queue,allocator,(ulong)layout);
  }
  local_38 = ::vk::mapVkFormat(this->m_format);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,&local_38,width,height,depth,
             (this->m_pixelAccessData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

tcu::ConstPixelBufferAccess Image::readVolume (vk::VkQueue					queue,
											   vk::Allocator&				allocator,
											   vk::VkImageLayout			layout,
											   vk::VkOffset3D				offset,
											   int							width,
											   int							height,
											   int							depth,
											   vk::VkImageAspectFlagBits	aspect,
											   unsigned int					mipLevel,
											   unsigned int					arrayElement)
{
	m_pixelAccessData.resize(width * height * depth * vk::mapVkFormat(m_format).getPixelSize());
	deMemset(m_pixelAccessData.data(), 0, m_pixelAccessData.size());
	if (aspect == vk::VK_IMAGE_ASPECT_COLOR_BIT)
	{
		read(queue, allocator, layout, offset, width, height, depth, mipLevel, arrayElement, aspect, vk::VK_IMAGE_TYPE_3D,
		m_pixelAccessData.data());
	}
	if (aspect == vk::VK_IMAGE_ASPECT_DEPTH_BIT || aspect == vk::VK_IMAGE_ASPECT_STENCIL_BIT)
	{
		readUsingBuffer(queue, allocator, layout, offset, width, height, depth, mipLevel, arrayElement, aspect, m_pixelAccessData.data());
	}
	return tcu::ConstPixelBufferAccess(vk::mapVkFormat(m_format), width, height, depth, m_pixelAccessData.data());
}